

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_rewriter.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ExpressionRewriter::ApplyRules
          (ExpressionRewriter *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Rule>,_true> *rules,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
          bool *changes_made,bool is_root)

{
  pointer prVar1;
  pointer pcVar2;
  int iVar3;
  pointer pEVar4;
  type pEVar5;
  pointer pEVar6;
  pointer prVar7;
  int iVar8;
  bool bVar9;
  bool rule_made_change;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> result;
  string alias;
  vector<std::reference_wrapper<duckdb::Expression>,_true> bindings;
  char local_a1;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_a0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_98;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  bool *local_88;
  uint local_7c;
  _Any_data local_78;
  _Manager_type local_68;
  code *pcStack_60;
  vector<std::reference_wrapper<duckdb::Rule>,_true> *local_50;
  void *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  prVar7 = (rules->
           super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar1 = (rules->
           super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar9 = prVar7 == prVar1;
  local_90._M_head_impl = (Expression *)this;
  local_88 = changes_made;
  local_50 = rules;
  if (!bVar9) {
    local_7c = (uint)is_root;
    do {
      local_48 = (void *)0x0;
      uStack_40 = 0;
      local_38 = 0;
      pEVar4 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
               ::operator->(&prVar7->_M_data->root);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(expr);
      iVar3 = (*pEVar4->_vptr_ExpressionMatcher[2])(pEVar4,pEVar5,&local_48);
      iVar8 = 0;
      if ((char)iVar3 != '\0') {
        local_a1 = '\0';
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(expr);
        local_78._M_unused._M_object = &local_68;
        pcVar2 = (pEVar6->super_BaseExpression).alias._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar2,
                   pcVar2 + (pEVar6->super_BaseExpression).alias._M_string_length);
        (*prVar7->_M_data->_vptr_Rule[2])(&local_a0,prVar7->_M_data,op,&local_48,&local_a1);
        if (local_a0._M_head_impl == (Expression *)0x0) {
          iVar8 = 3;
          if (local_a1 == '\x01') {
            *local_88 = true;
            ((local_90._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
                 (_func_int **)
                 (expr->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
            _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            goto LAB_00d5b33b;
          }
        }
        else {
          *local_88 = true;
          if (local_78._8_8_ != 0) {
            pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                 *)&local_a0);
            ::std::__cxx11::string::operator=
                      ((string *)&(pEVar6->super_BaseExpression).alias,
                       (string *)local_78._M_pod_data);
          }
          local_98._M_head_impl = local_a0._M_head_impl;
          local_a0._M_head_impl = (Expression *)0x0;
          ApplyRules((ExpressionRewriter *)local_90._M_head_impl,op,local_50,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_98,local_88,false);
          if (local_98._M_head_impl != (Expression *)0x0) {
            (*((local_98._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_98._M_head_impl = (Expression *)0x0;
LAB_00d5b33b:
          iVar8 = 1;
        }
        if (local_a0._M_head_impl != (Expression *)0x0) {
          (*((local_a0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        if ((_Manager_type *)local_78._M_unused._0_8_ != &local_68) {
          operator_delete(local_78._M_unused._M_object);
        }
      }
      if (local_48 != (void *)0x0) {
        operator_delete(local_48);
      }
      if ((iVar8 != 3) && (iVar8 != 0)) {
        if (!bVar9) {
          return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)
                 local_90._M_head_impl;
        }
        break;
      }
      prVar7 = prVar7 + 1;
      bVar9 = prVar7 == prVar1;
    } while (!bVar9);
  }
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (expr);
  local_68 = (_Manager_type)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(LogicalOperator **)local_78._M_unused._0_8_ = op;
  *(vector<std::reference_wrapper<duckdb::Rule>,_true> **)((long)local_78._M_unused._0_8_ + 8) =
       local_50;
  *(bool **)((long)local_78._M_unused._0_8_ + 0x10) = local_88;
  pcStack_60 = ::std::
               _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/expression_rewriter.cpp:41:47)>
               ::_M_invoke;
  local_68 = ::std::
             _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/expression_rewriter.cpp:41:47)>
             ::_M_manager;
  ExpressionIterator::EnumerateChildren
            (pEVar5,(function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
                     *)&local_78);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  *(Expression **)local_90._M_head_impl =
       (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         local_90._M_head_impl;
}

Assistant:

unique_ptr<Expression> ExpressionRewriter::ApplyRules(LogicalOperator &op, const vector<reference<Rule>> &rules,
                                                      unique_ptr<Expression> expr, bool &changes_made, bool is_root) {
	for (auto &rule : rules) {
		vector<reference<Expression>> bindings;
		if (rule.get().root->Match(*expr, bindings)) {
			// the rule matches! try to apply it
			bool rule_made_change = false;
			auto alias = expr->alias;
			auto result = rule.get().Apply(op, bindings, rule_made_change, is_root);
			if (result) {
				changes_made = true;
				// the base node changed: the rule applied changes
				// rerun on the new node
				if (!alias.empty()) {
					result->alias = std::move(alias);
				}
				return ExpressionRewriter::ApplyRules(op, rules, std::move(result), changes_made);
			} else if (rule_made_change) {
				changes_made = true;
				// the base node didn't change, but changes were made, rerun
				return expr;
			}
			// else nothing changed, continue to the next rule
			continue;
		}
	}
	// no changes could be made to this node
	// recursively run on the children of this node
	ExpressionIterator::EnumerateChildren(*expr, [&](unique_ptr<Expression> &child) {
		child = ExpressionRewriter::ApplyRules(op, rules, std::move(child), changes_made);
	});
	return expr;
}